

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O0

void test_iterate(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  size_t i;
  size_t k;
  int k_1;
  bitset_t *b;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  bitset_t *in_stack_ffffffffffffffe0;
  char *file;
  char *in_stack_ffffffffffffffe8;
  char *expression;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  bitset = bitset_create();
  for (iVar2 = 0; iVar2 < 1000; iVar2 = iVar2 + 1) {
    bitset_set(in_stack_ffffffffffffffe0,
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  bitset_count(in_stack_ffffffffffffffe0);
  _assert_true(CONCAT44(iVar2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  compute_cardinality(in_stack_ffffffffffffffe0);
  _assert_true(CONCAT44(iVar2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  expression = (char *)0x0;
  file = (char *)0x0;
  while( true ) {
    _Var1 = bitset_next_set_bit(bitset,(size_t *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
    if (!_Var1) break;
    _assert_true(CONCAT44(iVar2,in_stack_fffffffffffffff0),expression,file,in_stack_ffffffffffffffdc
                );
    expression = expression + 3;
    file = file + 1;
  }
  _assert_true(CONCAT44(iVar2,in_stack_fffffffffffffff0),expression,file,in_stack_ffffffffffffffdc);
  bitset_free((bitset_t *)0x102a2c);
  return;
}

Assistant:

DEFINE_TEST(test_iterate) {
    bitset_t *b = bitset_create();
    for (int k = 0; k < 1000; ++k) bitset_set(b, 3 * k);
    assert_true(bitset_count(b) == 1000);
    assert_true(compute_cardinality(b) == 1000);
    size_t k = 0;
    for (size_t i = 0; bitset_next_set_bit(b, &i); i++) {
        assert_true(i == k);
        k += 3;
    }
    assert_true(k == 3000);
    bitset_free(b);
}